

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixNormalsStep.cpp
# Opt level: O1

void __thiscall
Assimp::FixInfacingNormalsProcess::Execute(FixInfacingNormalsProcess *this,aiScene *pScene)

{
  bool bVar1;
  Logger *pLVar2;
  char *message;
  ulong uVar3;
  bool bVar4;
  
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"FixInfacingNormalsProcess begin");
  if (pScene->mNumMeshes != 0) {
    uVar3 = 0;
    bVar4 = false;
    do {
      bVar1 = ProcessMesh((FixInfacingNormalsProcess *)pLVar2,pScene->mMeshes[uVar3],(uint)uVar3);
      if (bVar1) {
        bVar4 = true;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < pScene->mNumMeshes);
    if (bVar4) {
      message = "FixInfacingNormalsProcess finished. Found issues.";
      goto LAB_003d97f4;
    }
  }
  message = "FixInfacingNormalsProcess finished. No changes to the scene.";
LAB_003d97f4:
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,message);
  return;
}

Assistant:

void FixInfacingNormalsProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("FixInfacingNormalsProcess begin");

    bool bHas( false );
    for (unsigned int a = 0; a < pScene->mNumMeshes; ++a) {
        if (ProcessMesh(pScene->mMeshes[a], a)) {
            bHas = true;
        }
    }

    if (bHas) {
        ASSIMP_LOG_DEBUG("FixInfacingNormalsProcess finished. Found issues.");
    } else {
        ASSIMP_LOG_DEBUG("FixInfacingNormalsProcess finished. No changes to the scene.");
    }
}